

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD2Loader.cpp
# Opt level: O2

bool __thiscall
Assimp::MD2Importer::CanRead(MD2Importer *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  uint32_t tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"md2");
  bVar2 = true;
  if (!bVar1) {
    if (extension._M_string_length == 0 || checkSig) {
      tokens[0] = 0x32504449;
      bVar2 = BaseImporter::CheckMagicToken(pIOHandler,pFile,tokens,1,0,4);
    }
    else {
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool MD2Importer::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "md2")
        return true;

    // if check for extension is not enough, check for the magic tokens
    if (!extension.length() || checkSig) {
        uint32_t tokens[1];
        tokens[0] = AI_MD2_MAGIC_NUMBER_LE;
        return CheckMagicToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}